

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution1D_x86::forward(Convolution1D_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  _func_int *p_Var9;
  long lVar10;
  void *pvVar11;
  size_t sVar12;
  size_t sVar13;
  void *pvVar14;
  size_t sVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uint uVar18;
  undefined1 auVar19 [16];
  int iVar20;
  int *piVar21;
  byte bVar22;
  ulong uVar23;
  long lVar24;
  float *pfVar25;
  ulong uVar26;
  float *pfVar27;
  int iVar28;
  long lVar29;
  ulong uVar30;
  float *pfVar31;
  ulong uVar32;
  int iVar33;
  int iVar34;
  uint uVar35;
  ulong uVar36;
  int iVar37;
  int iVar38;
  ulong uVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  undefined4 *puVar43;
  int iVar44;
  ulong uVar45;
  float *pfVar46;
  int iVar47;
  long lVar48;
  long lVar49;
  float *pfVar50;
  undefined4 *puVar51;
  ulong uVar52;
  long lVar53;
  long lVar54;
  ulong uVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  float extraout_XMM0_Db;
  v4sf one;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 extraout_var_00 [12];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined8 uVar83;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar87;
  float fVar96;
  float fVar97;
  __m128 pos;
  float fVar98;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar112;
  float fVar113;
  float fVar114;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  long local_1c8;
  int local_1c0;
  undefined1 (*local_1b0) [16];
  int local_180;
  float fStack_164;
  int local_148;
  Mat local_b8;
  ulong local_70;
  undefined1 local_68 [16];
  ulong local_58;
  ulong local_50;
  long local_48;
  long local_40;
  long local_38;
  undefined1 extraout_var [12];
  
  uVar23 = bottom_blob->elemsize;
  iVar6 = bottom_blob->elempack;
  p_Var9 = this->_vptr_Convolution1D_x86[-3];
  iVar7 = *(int *)(&this->field_0xd4 + (long)p_Var9);
  iVar8 = *(int *)(&this->field_0xd8 + (long)p_Var9);
  local_b8.cstep = 0;
  local_b8.data = (void *)0x0;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.elemsize._0_4_ = 0;
  local_b8.elemsize._4_4_ = 0;
  local_b8.elempack = 0;
  local_b8.allocator = (Allocator *)0x0;
  local_b8.dims = 0;
  local_b8.w = 0;
  local_b8.h = 0;
  local_b8.d = 0;
  local_b8.c = 0;
  Convolution1D::make_padding
            ((Convolution1D *)((long)&this->_vptr_Convolution1D_x86 + (long)p_Var9),bottom_blob,
             &local_b8,opt);
  iVar28 = -100;
  if ((local_b8.data != (void *)0x0) && ((long)local_b8.c * local_b8.cstep != 0)) {
    bVar22 = (*(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86[-3]) & 3) == 0 &
             opt->use_packing_layout;
    iVar44 = (uint)bVar22 + (uint)bVar22 * 2 + 1;
    Mat::create(top_blob,(~((iVar7 + -1) * iVar8) + local_b8.w) /
                         *(int *)(&this->field_0xdc + (long)this->_vptr_Convolution1D_x86[-3]) + 1,
                (int)*(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86[-3]) / iVar44
                ,uVar23 / (ulong)(long)iVar6 << bVar22 * '\x02',iVar44,opt->blob_allocator);
    iVar6 = local_b8.elempack;
    auVar84 = _DAT_004f14d0;
    auVar85 = _DAT_004f14c0;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      p_Var9 = this->_vptr_Convolution1D_x86[-3];
      lVar56 = (long)*(int *)(&this->field_0xd8 + (long)p_Var9);
      iVar7 = *(int *)(&this->field_0xdc + (long)p_Var9);
      iVar8 = *(int *)(&this->field_0xf4 + (long)p_Var9);
      lVar41 = (long)local_b8.elempack;
      lVar53 = (long)local_b8.h;
      iVar28 = local_b8.w * local_b8.elempack;
      local_50 = (ulong)top_blob->w;
      local_70 = (long)top_blob->h * (long)top_blob->elempack;
      lVar48 = (long)top_blob->elempack * local_50;
      lVar10 = *(long *)(&this->field_0x190 + (long)p_Var9);
      uVar23 = (long)((ulong)(uint)((int)local_70 >> 0x1f) << 0x20 | local_70 & 0xffffffff) / 4;
      iVar33 = *(int *)(&this->field_0xd8 + (long)p_Var9) * 4;
      lVar58 = (long)iVar28;
      iVar20 = iVar28 * 2;
      iVar28 = iVar28 * 3;
      iVar44 = (int)lVar48;
      lVar29 = (long)(iVar44 * 2);
      local_68._0_8_ = lVar29;
      uVar45 = 0;
      uVar18 = *(uint *)(&this->field_0xd4 + (long)p_Var9);
      if ((int)*(uint *)(&this->field_0xd4 + (long)p_Var9) < 1) {
        uVar18 = 0;
      }
      uVar55 = (ulong)uVar18;
      iVar38 = (int)uVar23;
      uVar30 = 0;
      if (0 < iVar38) {
        uVar30 = uVar23 & 0xffffffff;
      }
      lVar57 = lVar56 * 4;
      lVar1 = (long)iVar7 * 4;
      for (; uVar45 != uVar30; uVar45 = uVar45 + 1) {
        uVar35 = top_blob->w;
        iVar37 = top_blob->elempack;
        local_1b0 = (undefined1 (*) [16])
                    ((long)(int)((long)((ulong)(uint)((int)(uVar45 * 4) >> 0x1f) << 0x20 |
                                       uVar45 * 4 & 0xffffffff) / (long)iVar37) * (long)(int)uVar35
                     * top_blob->elemsize + (long)top_blob->data);
        lVar49 = (long)local_b8.h * (long)local_b8.elempack;
        lVar40 = 0;
        uVar23 = 0;
        if (0 < (int)uVar35) {
          uVar23 = (ulong)uVar35;
        }
        iVar47 = 0;
        local_1c8 = lVar58 * 4;
        for (uVar26 = 0; uVar26 != uVar23; uVar26 = uVar26 + 1) {
          fVar87 = 0.0;
          fVar96 = 0.0;
          fVar97 = 0.0;
          fVar98 = 0.0;
          fVar105 = 0.0;
          fVar106 = 0.0;
          fVar107 = 0.0;
          fVar108 = 0.0;
          if (lVar10 != 0) {
            pfVar31 = (float *)(lVar10 + uVar45 * 0x10);
            fVar105 = *pfVar31;
            fVar106 = pfVar31[1];
            fVar107 = pfVar31[2];
            fVar108 = pfVar31[3];
          }
          pfVar50 = (float *)((this->weight_data_tm).cstep * uVar45 *
                              (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
          local_1c0 = (int)uVar26;
          lVar42 = (long)local_b8.w *
                   CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
          lVar54 = (long)local_b8.data + local_1c8;
          pfVar31 = (float *)((long)local_b8.data + lVar40);
          uVar39 = 0;
          fVar99 = 0.0;
          fVar100 = 0.0;
          fVar101 = 0.0;
          fVar103 = 0.0;
          fVar109 = 0.0;
          fVar112 = 0.0;
          fVar113 = 0.0;
          fVar114 = 0.0;
          while( true ) {
            local_148 = (int)lVar49;
            if (local_148 <= (int)((uint)uVar39 | 3)) break;
            lVar24 = (int)((long)((ulong)(uint)((int)(uint)uVar39 >> 0x1f) << 0x20 |
                                 uVar39 & 0xffffffff) / (long)local_b8.elempack) * lVar42;
            if (local_b8.elempack == 4) {
              pfVar25 = (float *)((long)local_b8.data + lVar24 + (long)iVar47 * 4);
              uVar52 = uVar55;
              pfVar27 = pfVar50;
              while (iVar34 = (int)uVar52, uVar52 = (ulong)(iVar34 - 1), iVar34 != 0) {
                fVar102 = *pfVar25;
                fVar104 = pfVar25[1];
                fVar2 = pfVar25[2];
                fVar3 = pfVar25[3];
                fVar105 = fVar105 + fVar102 * *pfVar27;
                fVar106 = fVar106 + fVar102 * pfVar27[1];
                fVar107 = fVar107 + fVar102 * pfVar27[2];
                fVar108 = fVar108 + fVar102 * pfVar27[3];
                fVar109 = fVar109 + fVar104 * pfVar27[4];
                fVar112 = fVar112 + fVar104 * pfVar27[5];
                fVar113 = fVar113 + fVar104 * pfVar27[6];
                fVar114 = fVar114 + fVar104 * pfVar27[7];
                fVar99 = fVar99 + fVar2 * pfVar27[8];
                fVar100 = fVar100 + fVar2 * pfVar27[9];
                fVar101 = fVar101 + fVar2 * pfVar27[10];
                fVar103 = fVar103 + fVar2 * pfVar27[0xb];
                fVar87 = fVar87 + fVar3 * pfVar27[0xc];
                fVar96 = fVar96 + fVar3 * pfVar27[0xd];
                fVar97 = fVar97 + fVar3 * pfVar27[0xe];
                fVar98 = fVar98 + fVar3 * pfVar27[0xf];
                pfVar27 = pfVar27 + 0x10;
                pfVar25 = pfVar25 + iVar33;
              }
              pfVar50 = pfVar50 + uVar55 * 0x10;
            }
            else {
              pfVar25 = (float *)((long)local_b8.data +
                                 lVar24 + (long)(local_b8.elempack * iVar7 * local_1c0) * 4);
            }
            uVar52 = uVar55;
            pfVar27 = pfVar50;
            if (local_b8.elempack == 1) {
              while ((int)uVar52 != 0) {
                fVar102 = *pfVar25;
                fVar105 = fVar105 + fVar102 * *pfVar27;
                fVar106 = fVar106 + fVar102 * pfVar27[1];
                fVar107 = fVar107 + fVar102 * pfVar27[2];
                fVar108 = fVar108 + fVar102 * pfVar27[3];
                fVar102 = pfVar25[lVar58];
                fVar109 = fVar109 + fVar102 * pfVar27[4];
                fVar112 = fVar112 + fVar102 * pfVar27[5];
                fVar113 = fVar113 + fVar102 * pfVar27[6];
                fVar114 = fVar114 + fVar102 * pfVar27[7];
                fVar102 = pfVar25[iVar20];
                fVar104 = pfVar25[iVar28];
                fVar99 = fVar99 + fVar102 * pfVar27[8];
                fVar100 = fVar100 + fVar102 * pfVar27[9];
                fVar101 = fVar101 + fVar102 * pfVar27[10];
                fVar103 = fVar103 + fVar102 * pfVar27[0xb];
                fVar87 = fVar87 + fVar104 * pfVar27[0xc];
                fVar96 = fVar96 + fVar104 * pfVar27[0xd];
                fVar97 = fVar97 + fVar104 * pfVar27[0xe];
                fVar98 = fVar98 + fVar104 * pfVar27[0xf];
                pfVar25 = pfVar25 + lVar56;
                uVar52 = (ulong)((int)uVar52 - 1);
                pfVar27 = pfVar27 + 0x10;
              }
              pfVar50 = pfVar50 + uVar55 * 0x10;
            }
            uVar39 = uVar39 + 4;
            lVar54 = lVar54 + lVar42 * 4;
            pfVar31 = pfVar31 + lVar42;
          }
          for (; (long)(uVar39 | 1) < lVar49; uVar39 = uVar39 + 2) {
            lVar24 = 0;
            uVar52 = uVar55;
            pfVar25 = pfVar50;
            while (iVar34 = (int)uVar52, uVar52 = (ulong)(iVar34 - 1), iVar34 != 0) {
              fVar102 = *(float *)((long)pfVar31 + lVar24);
              fVar104 = *(float *)(lVar54 + lVar24);
              fVar105 = fVar105 + fVar102 * *pfVar25;
              fVar106 = fVar106 + fVar102 * pfVar25[1];
              fVar107 = fVar107 + fVar102 * pfVar25[2];
              fVar108 = fVar108 + fVar102 * pfVar25[3];
              fVar109 = fVar109 + fVar104 * pfVar25[4];
              fVar112 = fVar112 + fVar104 * pfVar25[5];
              fVar113 = fVar113 + fVar104 * pfVar25[6];
              fVar114 = fVar114 + fVar104 * pfVar25[7];
              pfVar25 = pfVar25 + 8;
              lVar24 = lVar24 + lVar57;
            }
            pfVar50 = pfVar50 + uVar55 * 8;
            lVar54 = lVar54 + lVar42 * 2;
            pfVar31 = (float *)((long)pfVar31 + lVar42 * 2);
          }
          for (; uVar52 = uVar55, pfVar25 = pfVar31, pfVar27 = pfVar50, (long)uVar39 < lVar49;
              uVar39 = uVar39 + 1) {
            while ((int)uVar52 != 0) {
              fVar102 = *pfVar25;
              fVar105 = fVar105 + fVar102 * *pfVar27;
              fVar106 = fVar106 + fVar102 * pfVar27[1];
              fVar107 = fVar107 + fVar102 * pfVar27[2];
              fVar108 = fVar108 + fVar102 * pfVar27[3];
              uVar52 = (ulong)((int)uVar52 - 1);
              pfVar25 = pfVar25 + lVar56;
              pfVar27 = pfVar27 + 4;
            }
            pfVar50 = pfVar50 + uVar55 * 4;
            pfVar31 = (float *)((long)pfVar31 + lVar42);
          }
          fVar105 = fVar109 + fVar105 + fVar99 + fVar87;
          fVar106 = fVar112 + fVar106 + fVar100 + fVar96;
          auVar111._0_8_ = CONCAT44(fVar106,fVar105);
          auVar111._8_4_ = fVar113 + fVar107 + fVar101 + fVar97;
          auVar111._12_4_ = fVar114 + fVar108 + fVar103 + fVar98;
          if (5 < iVar8 - 1U) {
            auVar89._8_4_ = auVar111._8_4_;
            auVar89._0_8_ = auVar111._0_8_;
            auVar89._12_4_ = auVar111._12_4_;
            goto switchD_004944f0_caseD_1;
          }
          auVar88._8_4_ = auVar111._8_4_;
          auVar88._0_8_ = auVar111._0_8_;
          auVar88._12_4_ = auVar111._12_4_;
          auVar89 = maxps(auVar88,ZEXT816(0));
          fVar107 = auVar85._0_4_;
          fVar108 = auVar85._4_4_;
          fVar87 = auVar85._8_4_;
          fVar96 = auVar85._12_4_;
          fVar97 = auVar84._0_4_;
          fVar98 = auVar84._4_4_;
          fVar99 = auVar84._8_4_;
          fVar100 = auVar84._12_4_;
          switch(iVar8) {
          case 2:
            auVar111 = minps(auVar111,ZEXT816(0));
            fVar105 = **(float **)(&this->field_0xf8 + (long)p_Var9);
            auVar71._0_4_ = fVar105 * auVar111._0_4_;
            auVar71._4_4_ = fVar105 * auVar111._4_4_;
            auVar71._8_4_ = fVar105 * auVar111._8_4_;
            auVar71._12_4_ = fVar105 * auVar111._12_4_;
            auVar92 = auVar89;
            goto LAB_00494861;
          case 3:
            uVar4 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var9);
            uVar5 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var9))[1];
            auVar69._4_4_ = uVar4;
            auVar69._0_4_ = uVar4;
            auVar69._8_4_ = uVar4;
            auVar69._12_4_ = uVar4;
            auVar76._4_4_ = uVar5;
            auVar76._0_4_ = uVar5;
            auVar76._8_4_ = uVar5;
            auVar76._12_4_ = uVar5;
            auVar111 = maxps(auVar111,auVar69);
            auVar89 = minps(auVar111,auVar76);
            break;
          case 4:
            auVar110._0_8_ = CONCAT44(fVar106,fVar105) ^ 0x8000000080000000;
            auVar110._8_4_ = -auVar111._8_4_;
            auVar110._12_4_ = -auVar111._12_4_;
            auVar111 = minps(auVar110,_DAT_004f1490);
            auVar111 = maxps(auVar111,_DAT_004f14a0);
            fVar106 = auVar111._0_4_ * 1.442695 + fVar107;
            fVar103 = auVar111._4_4_ * 1.442695 + fVar108;
            fVar112 = auVar111._8_4_ * 1.442695 + fVar87;
            fVar114 = auVar111._12_4_ * 1.442695 + fVar96;
            fVar105 = (float)(int)fVar106;
            fVar101 = (float)(int)fVar103;
            fVar109 = (float)(int)fVar112;
            fVar113 = (float)(int)fVar114;
            fVar105 = fVar105 - (float)(-(uint)(fVar106 < fVar105) & (uint)fVar97);
            fVar101 = fVar101 - (float)(-(uint)(fVar103 < fVar101) & (uint)fVar98);
            fVar109 = fVar109 - (float)(-(uint)(fVar112 < fVar109) & (uint)fVar99);
            fVar113 = fVar113 - (float)(-(uint)(fVar114 < fVar113) & (uint)fVar100);
            fVar106 = fVar105 * -0.6931472 + auVar111._0_4_;
            fVar103 = fVar101 * -0.6931472 + auVar111._4_4_;
            fVar112 = fVar109 * -0.6931472 + auVar111._8_4_;
            fVar114 = fVar113 * -0.6931472 + auVar111._12_4_;
            auVar70._0_4_ =
                 fVar106 + fVar97 +
                 (((((fVar106 * 0.00019875691 + 0.0013981999) * fVar106 + 0.008333452) * fVar106 +
                   0.041665796) * fVar106 + 0.16666666) * fVar106 + fVar107) * fVar106 * fVar106;
            auVar70._4_4_ =
                 fVar103 + fVar98 +
                 (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) * fVar103 +
                   0.041665796) * fVar103 + 0.16666666) * fVar103 + fVar108) * fVar103 * fVar103;
            auVar70._8_4_ =
                 fVar112 + fVar99 +
                 (((((fVar112 * 0.00019875691 + 0.0013981999) * fVar112 + 0.008333452) * fVar112 +
                   0.041665796) * fVar112 + 0.16666666) * fVar112 + fVar87) * fVar112 * fVar112;
            auVar70._12_4_ =
                 fVar114 + fVar100 +
                 (((((fVar114 * 0.00019875691 + 0.0013981999) * fVar114 + 0.008333452) * fVar114 +
                   0.041665796) * fVar114 + 0.16666666) * fVar114 + fVar96) * fVar114 * fVar114;
            auVar77._0_4_ = (float)((int)fVar105 * 0x800000 + (int)fVar97) * auVar70._0_4_ + fVar97;
            auVar77._4_4_ = (float)((int)fVar101 * 0x800000 + (int)fVar98) * auVar70._4_4_ + fVar98;
            auVar77._8_4_ = (float)((int)fVar109 * 0x800000 + (int)fVar99) * auVar70._8_4_ + fVar99;
            auVar77._12_4_ =
                 (float)((int)fVar113 * 0x800000 + (int)fVar100) * auVar70._12_4_ + fVar100;
            auVar71 = rcpps(auVar70,auVar77);
            auVar92._0_4_ = (fVar97 - auVar77._0_4_ * auVar71._0_4_) * auVar71._0_4_;
            auVar92._4_4_ = (fVar98 - auVar77._4_4_ * auVar71._4_4_) * auVar71._4_4_;
            auVar92._8_4_ = (fVar99 - auVar77._8_4_ * auVar71._8_4_) * auVar71._8_4_;
            auVar92._12_4_ = (fVar100 - auVar77._12_4_ * auVar71._12_4_) * auVar71._12_4_;
LAB_00494861:
            auVar89._0_4_ = auVar92._0_4_ + auVar71._0_4_;
            auVar89._4_4_ = auVar92._4_4_ + auVar71._4_4_;
            auVar89._8_4_ = auVar92._8_4_ + auVar71._8_4_;
            auVar89._12_4_ = auVar92._12_4_ + auVar71._12_4_;
            break;
          case 5:
            auVar66._8_4_ = auVar111._8_4_;
            auVar66._0_8_ = auVar111._0_8_;
            auVar66._12_4_ = auVar111._12_4_;
            auVar89 = minps(auVar66,_DAT_004f1490);
            auVar89 = maxps(auVar89,_DAT_004f14a0);
            fVar101 = auVar89._0_4_ * 1.442695 + fVar107;
            fVar103 = auVar89._4_4_ * 1.442695 + fVar108;
            fVar109 = auVar89._8_4_ * 1.442695 + fVar87;
            fVar112 = auVar89._12_4_ * 1.442695 + fVar96;
            fVar113 = (float)(int)fVar101;
            fVar114 = (float)(int)fVar103;
            fVar102 = (float)(int)fVar109;
            fVar104 = (float)(int)fVar112;
            fVar113 = fVar113 - (float)(-(uint)(fVar101 < fVar113) & (uint)fVar97);
            fVar114 = fVar114 - (float)(-(uint)(fVar103 < fVar114) & (uint)fVar98);
            fVar102 = fVar102 - (float)(-(uint)(fVar109 < fVar102) & (uint)fVar99);
            fVar104 = fVar104 - (float)(-(uint)(fVar112 < fVar104) & (uint)fVar100);
            fVar101 = auVar89._0_4_ - fVar113 * 0.6931472;
            fVar103 = auVar89._4_4_ - fVar114 * 0.6931472;
            fVar109 = auVar89._8_4_ - fVar102 * 0.6931472;
            fVar112 = auVar89._12_4_ - fVar104 * 0.6931472;
            auVar90._0_4_ =
                 (float)((int)fVar113 * 0x800000 + (int)fVar97) *
                 (fVar101 + fVar97 +
                 (((((fVar101 * 0.00019875691 + 0.0013981999) * fVar101 + 0.008333452) * fVar101 +
                   0.041665796) * fVar101 + 0.16666666) * fVar101 + fVar107) * fVar101 * fVar101) +
                 fVar97;
            auVar90._4_4_ =
                 (float)((int)fVar114 * 0x800000 + (int)fVar98) *
                 (fVar103 + fVar98 +
                 (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) * fVar103 +
                   0.041665796) * fVar103 + 0.16666666) * fVar103 + fVar108) * fVar103 * fVar103) +
                 fVar98;
            auVar90._8_4_ =
                 (float)((int)fVar102 * 0x800000 + (int)fVar99) *
                 (fVar109 + fVar99 +
                 (((((fVar109 * 0.00019875691 + 0.0013981999) * fVar109 + 0.008333452) * fVar109 +
                   0.041665796) * fVar109 + 0.16666666) * fVar109 + fVar87) * fVar109 * fVar109) +
                 fVar99;
            auVar90._12_4_ =
                 (float)((int)fVar104 * 0x800000 + (int)fVar100) *
                 (fVar112 + fVar100 +
                 (((((fVar112 * 0.00019875691 + 0.0013981999) * fVar112 + 0.008333452) * fVar112 +
                   0.041665796) * fVar112 + 0.16666666) * fVar112 + fVar96) * fVar112 * fVar112) +
                 fVar100;
            auVar89 = maxps(auVar90,_DAT_004f1540);
            auVar91._0_8_ = auVar89._0_8_ & 0x807fffff807fffff;
            auVar91._8_4_ = auVar89._8_4_ & 0x807fffff;
            auVar91._12_4_ = auVar89._12_4_ & 0x807fffff;
            auVar91 = auVar91 | auVar85;
            fVar101 = auVar91._0_4_;
            fVar109 = auVar91._4_4_;
            fVar113 = auVar91._8_4_;
            fVar102 = auVar91._12_4_;
            fVar103 = fVar101 + (float)DAT_004f1580 +
                      (float)(-(uint)(fVar101 < 0.70710677) & (uint)fVar101);
            fVar112 = fVar109 + DAT_004f1580._4_4_ +
                      (float)(-(uint)(fVar109 < 0.70710677) & (uint)fVar109);
            fVar114 = fVar113 + DAT_004f1580._8_4_ +
                      (float)(-(uint)(fVar113 < 0.70710677) & (uint)fVar113);
            fVar104 = fVar102 + DAT_004f1580._12_4_ +
                      (float)(-(uint)(fVar102 < 0.70710677) & (uint)fVar102);
            auVar75._0_4_ =
                 ~-(uint)(auVar90._0_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar89._0_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar101 < 0.70710677) & (uint)fVar97)) * 0.6931472 +
                         fVar103 +
                        (((((((((fVar103 * 0.070376836 + -0.1151461) * fVar103 + 0.116769984) *
                               fVar103 + -0.12420141) * fVar103 + 0.14249323) * fVar103 +
                            -0.16668057) * fVar103 + 0.20000714) * fVar103 + -0.24999994) * fVar103
                         + 0.3333333) * fVar103 + -0.5) * fVar103 * fVar103) * -2.0);
            auVar75._4_4_ =
                 ~-(uint)(auVar90._4_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar89._4_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar109 < 0.70710677) & (uint)fVar98)) * 0.6931472 +
                         fVar112 +
                        (((((((((fVar112 * 0.070376836 + -0.1151461) * fVar112 + 0.116769984) *
                               fVar112 + -0.12420141) * fVar112 + 0.14249323) * fVar112 +
                            -0.16668057) * fVar112 + 0.20000714) * fVar112 + -0.24999994) * fVar112
                         + 0.3333333) * fVar112 + -0.5) * fVar112 * fVar112) * -2.0);
            auVar75._8_4_ =
                 ~-(uint)(auVar90._8_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar89._8_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar113 < 0.70710677) & (uint)fVar99)) * 0.6931472 +
                         fVar114 +
                        (((((((((fVar114 * 0.070376836 + -0.1151461) * fVar114 + 0.116769984) *
                               fVar114 + -0.12420141) * fVar114 + 0.14249323) * fVar114 +
                            -0.16668057) * fVar114 + 0.20000714) * fVar114 + -0.24999994) * fVar114
                         + 0.3333333) * fVar114 + -0.5) * fVar114 * fVar114) * -2.0);
            auVar75._12_4_ =
                 ~-(uint)(auVar90._12_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar89._12_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar102 < 0.70710677) & (uint)fVar100)) * 0.6931472 +
                         fVar104 +
                        (((((((((fVar104 * 0.070376836 + -0.1151461) * fVar104 + 0.116769984) *
                               fVar104 + -0.12420141) * fVar104 + 0.14249323) * fVar104 +
                            -0.16668057) * fVar104 + 0.20000714) * fVar104 + -0.24999994) * fVar104
                         + 0.3333333) * fVar104 + -0.5) * fVar104 * fVar104) * -2.0);
            auVar67._0_8_ =
                 CONCAT44(-(uint)(auVar90._4_4_ <= 0.0),-(uint)(auVar90._0_4_ <= 0.0)) &
                 0x7fffffff7fffffff;
            auVar67._8_4_ = -(uint)(auVar90._8_4_ <= 0.0) & 0x7fffffff;
            auVar67._12_4_ = -(uint)(auVar90._12_4_ <= 0.0) & 0x7fffffff;
            auVar89 = minps(auVar67 | auVar75,_DAT_004f1490);
            auVar89 = maxps(auVar89,_DAT_004f14a0);
            fVar101 = auVar89._0_4_ * 1.442695 + fVar107;
            fVar103 = auVar89._4_4_ * 1.442695 + fVar108;
            fVar109 = auVar89._8_4_ * 1.442695 + fVar87;
            fVar112 = auVar89._12_4_ * 1.442695 + fVar96;
            fVar113 = (float)(int)fVar101;
            fVar114 = (float)(int)fVar103;
            fVar102 = (float)(int)fVar109;
            fVar104 = (float)(int)fVar112;
            fVar113 = fVar113 - (float)(-(uint)(fVar101 < fVar113) & (uint)fVar97);
            fVar114 = fVar114 - (float)(-(uint)(fVar103 < fVar114) & (uint)fVar98);
            fVar102 = fVar102 - (float)(-(uint)(fVar109 < fVar102) & (uint)fVar99);
            fVar104 = fVar104 - (float)(-(uint)(fVar112 < fVar104) & (uint)fVar100);
            fVar101 = auVar89._0_4_ - fVar113 * 0.6931472;
            fVar103 = auVar89._4_4_ - fVar114 * 0.6931472;
            fVar109 = auVar89._8_4_ - fVar102 * 0.6931472;
            fVar112 = auVar89._12_4_ - fVar104 * 0.6931472;
            auVar68._0_4_ =
                 fVar101 + fVar97 +
                 (((((fVar101 * 0.00019875691 + 0.0013981999) * fVar101 + 0.008333452) * fVar101 +
                   0.041665796) * fVar101 + 0.16666666) * fVar101 + fVar107) * fVar101 * fVar101;
            auVar68._4_4_ =
                 fVar103 + fVar98 +
                 (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) * fVar103 +
                   0.041665796) * fVar103 + 0.16666666) * fVar103 + fVar108) * fVar103 * fVar103;
            auVar68._8_4_ =
                 fVar109 + fVar99 +
                 (((((fVar109 * 0.00019875691 + 0.0013981999) * fVar109 + 0.008333452) * fVar109 +
                   0.041665796) * fVar109 + 0.16666666) * fVar109 + fVar87) * fVar109 * fVar109;
            auVar68._12_4_ =
                 fVar112 + fVar100 +
                 (((((fVar112 * 0.00019875691 + 0.0013981999) * fVar112 + 0.008333452) * fVar112 +
                   0.041665796) * fVar112 + 0.16666666) * fVar112 + fVar96) * fVar112 * fVar112;
            fVar97 = (float)((int)fVar113 * 0x800000 + (int)fVar97) * auVar68._0_4_ + fVar97;
            fVar98 = (float)((int)fVar114 * 0x800000 + (int)fVar98) * auVar68._4_4_ + fVar98;
            fVar99 = (float)((int)fVar102 * 0x800000 + (int)fVar99) * auVar68._8_4_ + fVar99;
            fVar100 = (float)((int)fVar104 * 0x800000 + (int)fVar100) * auVar68._12_4_ + fVar100;
            auVar17._4_4_ = fVar98;
            auVar17._0_4_ = fVar97;
            auVar17._8_4_ = fVar99;
            auVar17._12_4_ = fVar100;
            auVar89 = rcpps(auVar68,auVar17);
            fVar107 = auVar89._0_4_;
            fVar108 = auVar89._4_4_;
            fVar87 = auVar89._8_4_;
            fVar96 = auVar89._12_4_;
            auVar94._0_4_ =
                 fVar107 + fVar107 + (float)DAT_004f1580 +
                 (2.0 - fVar97 * (fVar107 + fVar107)) * fVar107;
            auVar94._4_4_ =
                 fVar108 + fVar108 + DAT_004f1580._4_4_ +
                 (2.0 - fVar98 * (fVar108 + fVar108)) * fVar108;
            auVar94._8_4_ =
                 fVar87 + fVar87 + DAT_004f1580._8_4_ + (2.0 - fVar99 * (fVar87 + fVar87)) * fVar87;
            auVar94._12_4_ =
                 fVar96 + fVar96 + DAT_004f1580._12_4_ +
                 (2.0 - fVar100 * (fVar96 + fVar96)) * fVar96;
            goto LAB_0049489a;
          case 6:
            fVar107 = **(float **)(&this->field_0xf8 + (long)p_Var9);
            fVar108 = (*(float **)(&this->field_0xf8 + (long)p_Var9))[1];
            auVar93._0_4_ = fVar107 * fVar105 + fVar108;
            auVar93._4_4_ = fVar107 * fVar106 + fVar108;
            auVar93._8_4_ = fVar107 * auVar111._8_4_ + fVar108;
            auVar93._12_4_ = fVar107 * auVar111._12_4_ + fVar108;
            auVar89 = maxps(auVar93,ZEXT816(0));
            auVar94 = minps(auVar89,auVar84);
LAB_0049489a:
            auVar89._0_4_ = auVar94._0_4_ * fVar105;
            auVar89._4_4_ = auVar94._4_4_ * fVar106;
            auVar89._8_4_ = auVar94._8_4_ * auVar111._8_4_;
            auVar89._12_4_ = auVar94._12_4_ * auVar111._12_4_;
          }
switchD_004944f0_caseD_1:
          if (iVar37 == 1) {
            *(int *)*local_1b0 = auVar89._0_4_;
            *(int *)((long)*local_1b0 + lVar48 * 4) = auVar89._4_4_;
            *(int *)((long)*local_1b0 + lVar29 * 4) = auVar89._8_4_;
            *(int *)((long)*local_1b0 + (long)(iVar44 * 3) * 4) = auVar89._12_4_;
            local_1b0 = (undefined1 (*) [16])((long)*local_1b0 + 4);
          }
          else if (iVar37 == 4) {
            *local_1b0 = auVar89;
            local_1b0 = local_1b0 + 1;
          }
          iVar47 = iVar47 + local_b8.elempack * iVar7;
          local_1c8 = local_1c8 + lVar1;
          lVar40 = lVar40 + lVar1;
        }
      }
      uVar23 = (long)((int)local_70 + iVar38 * -4) / 2;
      local_58 = uVar23 & 0xffffffff;
      lVar29 = (long)local_b8.h * (long)local_b8.elempack;
      uVar35 = top_blob->w;
      pvVar11 = top_blob->data;
      local_38 = (long)(int)uVar35 * top_blob->elemsize;
      iVar44 = local_b8.elempack * iVar7;
      uVar45 = 0;
      if (0 < (int)uVar35) {
        uVar45 = (ulong)uVar35;
      }
      uVar30 = 0;
      if (0 < (int)uVar23) {
        uVar30 = uVar23 & 0xffffffff;
      }
      local_40 = (long)(iVar38 * 4);
      local_48 = lVar58 * 4;
      for (uVar23 = 0; uVar23 != uVar30; uVar23 = uVar23 + 1) {
        uVar26 = local_40 + uVar23 * 2;
        uVar39 = (ulong)(uint)((int)uVar26 >> 0x1f) << 0x20 | uVar26 & 0xffffffff;
        puVar51 = (undefined4 *)(uVar26 * local_38 + (long)pvVar11);
        sVar12 = (this->weight_data_tm).cstep;
        sVar13 = (this->weight_data_tm).elemsize;
        puVar43 = (undefined4 *)((local_40 + uVar23 * 2 + 1) * local_38 + (long)pvVar11);
        pvVar14 = (this->weight_data_tm).data;
        pfVar31 = *(float **)(&this->field_0xf8 + (long)p_Var9);
        lVar40 = 0;
        iVar37 = 0;
        lVar48 = local_48;
        for (uVar52 = 0; uVar52 != uVar45; uVar52 = uVar52 + 1) {
          fVar105 = 0.0;
          fVar106 = 0.0;
          fVar107 = 0.0;
          fVar108 = 0.0;
          uVar83 = 0;
          if (lVar10 != 0) {
            uVar83 = *(undefined8 *)(lVar10 + uVar26 * 4);
          }
          lVar54 = (long)local_b8.w *
                   CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
          lVar49 = (long)local_b8.data + lVar48;
          pfVar25 = (float *)((long)local_b8.data + lVar40);
          uVar32 = 0;
          fVar87 = 0.0;
          fVar96 = 0.0;
          fVar97 = 0.0;
          fVar98 = 0.0;
          pfVar50 = (float *)((long)(((int)((long)uVar39 % 4) >> 1) + (int)((long)uVar39 / 4)) *
                              sVar12 * sVar13 + (long)pvVar14);
          while( true ) {
            local_148 = (int)lVar29;
            if (local_148 <= (int)((uint)uVar32 | 3)) break;
            lVar42 = (int)((long)((ulong)(uint)((int)(uint)uVar32 >> 0x1f) << 0x20 |
                                 uVar32 & 0xffffffff) / (long)iVar6) * lVar54;
            if (iVar6 == 4) {
              pfVar27 = (float *)((long)local_b8.data + lVar42 + (long)iVar37 * 4);
              uVar36 = uVar55;
              pfVar46 = pfVar50;
              while (iVar47 = (int)uVar36, uVar36 = (ulong)(iVar47 - 1), iVar47 != 0) {
                fVar105 = fVar105 + *pfVar46 * *pfVar27;
                fVar106 = fVar106 + pfVar46[1] * pfVar27[1];
                fVar107 = fVar107 + pfVar46[2] * pfVar27[2];
                fVar108 = fVar108 + pfVar46[3] * pfVar27[3];
                fVar87 = fVar87 + *pfVar27 * pfVar46[4];
                fVar96 = fVar96 + pfVar27[1] * pfVar46[5];
                fVar97 = fVar97 + pfVar27[2] * pfVar46[6];
                fVar98 = fVar98 + pfVar27[3] * pfVar46[7];
                pfVar46 = pfVar46 + 8;
                pfVar27 = pfVar27 + iVar33;
              }
              pfVar50 = pfVar50 + uVar55 * 8;
            }
            else {
              pfVar27 = (float *)((long)local_b8.data + lVar42 + (long)(iVar44 * (int)uVar52) * 4);
            }
            uVar36 = uVar55;
            pfVar46 = pfVar50;
            if (iVar6 == 1) {
              while ((int)uVar36 != 0) {
                fVar105 = fVar105 + *pfVar46 * *pfVar27;
                fVar106 = fVar106 + pfVar46[1] * pfVar27[lVar58];
                fVar107 = fVar107 + pfVar46[2] * pfVar27[iVar20];
                fVar108 = fVar108 + pfVar46[3] * pfVar27[iVar28];
                fVar87 = fVar87 + *pfVar27 * pfVar46[4];
                fVar96 = fVar96 + pfVar27[lVar58] * pfVar46[5];
                fVar97 = fVar97 + pfVar27[iVar20] * pfVar46[6];
                fVar98 = fVar98 + pfVar27[iVar28] * pfVar46[7];
                pfVar27 = pfVar27 + lVar56;
                uVar36 = (ulong)((int)uVar36 - 1);
                pfVar46 = pfVar46 + 8;
              }
              pfVar50 = pfVar50 + uVar55 * 8;
            }
            uVar32 = uVar32 + 4;
            lVar49 = lVar49 + lVar54 * 4;
            pfVar25 = pfVar25 + lVar54;
          }
          auVar85._0_4_ = (float)uVar83 + fVar107 + fVar105 + fVar108 + fVar106;
          auVar85._4_4_ = (float)((ulong)uVar83 >> 0x20) + fVar97 + fVar87 + fVar98 + fVar96;
          auVar85._8_4_ = fVar108 + fVar106 + 0.0 + fVar107 + fVar107;
          auVar85._12_4_ = fVar98 + fVar96 + 0.0 + fVar108 + fVar108;
          for (; (long)(uVar32 | 1) < lVar29; uVar32 = uVar32 + 2) {
            lVar42 = 0;
            uVar36 = uVar55;
            pfVar27 = pfVar50;
            while (iVar47 = (int)uVar36, uVar36 = (ulong)(iVar47 - 1), iVar47 != 0) {
              fVar105 = *(float *)((long)pfVar25 + lVar42);
              fVar107 = auVar85._4_4_;
              fVar108 = auVar85._8_4_;
              fVar87 = auVar85._12_4_;
              fVar106 = *(float *)(lVar49 + lVar42);
              auVar85._0_4_ =
                   fVar106 * (float)*(undefined8 *)(pfVar27 + 2) +
                   (float)*(undefined8 *)pfVar27 * fVar105 + auVar85._0_4_;
              auVar85._4_4_ =
                   fVar106 * (float)((ulong)*(undefined8 *)(pfVar27 + 2) >> 0x20) +
                   (float)((ulong)*(undefined8 *)pfVar27 >> 0x20) * fVar105 + fVar107;
              auVar85._8_4_ = fVar106 * 0.0 + fVar105 * 0.0 + fVar108;
              auVar85._12_4_ = fVar106 * 0.0 + fVar105 * 0.0 + fVar87;
              pfVar27 = pfVar27 + 4;
              lVar42 = lVar42 + lVar57;
            }
            pfVar50 = pfVar50 + uVar55 * 4;
            lVar49 = lVar49 + lVar54 * 2;
            pfVar25 = (float *)((long)pfVar25 + lVar54 * 2);
          }
          for (; uVar36 = auVar85._0_8_, (long)uVar32 < lVar29; uVar32 = uVar32 + 1) {
            pfVar27 = pfVar25;
            for (lVar49 = 0; uVar18 != (uint)lVar49; lVar49 = lVar49 + 1) {
              fVar105 = *pfVar27;
              auVar84._0_4_ = auVar85._0_4_ + fVar105 * (float)*(undefined8 *)(pfVar50 + lVar49 * 2)
              ;
              auVar84._4_4_ =
                   auVar85._4_4_ +
                   fVar105 * (float)((ulong)*(undefined8 *)(pfVar50 + lVar49 * 2) >> 0x20);
              auVar84._8_4_ = auVar85._8_4_ + fVar105 * 0.0;
              auVar84._12_4_ = auVar85._12_4_ + fVar105 * 0.0;
              pfVar27 = pfVar27 + lVar56;
              auVar85 = auVar84;
            }
            pfVar50 = pfVar50 + uVar55 * 2;
            pfVar25 = (float *)((long)pfVar25 + lVar54);
          }
          if (iVar8 - 1U < 6) {
            fVar105 = auVar85._0_4_;
            fVar106 = auVar85._4_4_;
            auVar95._4_4_ = fVar106;
            auVar95._0_4_ = fVar106;
            auVar95._8_4_ = fVar106;
            auVar95._12_4_ = fVar106;
            switch(iVar8) {
            case 1:
              auVar85 = maxps(auVar85,_DAT_004ee060);
              uVar36 = auVar85._0_8_;
              break;
            case 2:
              fVar107 = *pfVar31;
              auVar79._0_4_ = ~-(uint)(0.0 < fVar105) & (uint)fVar107;
              auVar79._4_4_ = ~-(uint)(0.0 < fVar106) & (uint)fVar107;
              auVar79._8_4_ = ~-(uint)(0.0 < auVar85._8_4_) & (uint)fVar107;
              auVar79._12_4_ = ~-(uint)(0.0 < auVar85._12_4_) & (uint)fVar107;
              auVar64._0_8_ =
                   CONCAT44(-(uint)(0.0 < fVar106),-(uint)(0.0 < fVar105)) & 0x3f8000003f800000;
              auVar64._8_8_ = 0;
              uVar36 = CONCAT44(fVar106 * SUB164(auVar64 | auVar79,4),
                                fVar105 * SUB164(auVar64 | auVar79,0));
              break;
            case 3:
              uVar32 = *(ulong *)pfVar31;
              fVar107 = (float)uVar32;
              fVar108 = (float)(uVar32 >> 0x20);
              if (fVar107 <= fVar105) {
                uVar32 = (ulong)(uint)fVar105;
              }
              uVar35 = -(uint)(fVar108 < (float)uVar32);
              auVar80._0_4_ = ~-(uint)(fVar106 < fVar107) & (uint)fVar106;
              auVar80._4_4_ = ~uVar35 & (uint)(float)uVar32;
              auVar80._8_4_ = ~-(uint)(fVar106 < 0.0) & (uint)fVar106;
              auVar80._12_4_ = ~-(uint)(fVar106 < 0.0) & (uint)fVar106;
              auVar16._4_4_ = (uint)fVar108 & uVar35;
              auVar16._0_4_ = (uint)fVar107 & -(uint)(fVar106 < fVar107);
              auVar16._8_8_ = 0;
              fVar105 = SUB164(auVar80 | auVar16,0);
              if (fVar108 < fVar105) {
                fVar105 = fVar108;
              }
              uVar36 = CONCAT44(fVar105,SUB164(auVar80 | auVar16,4));
              break;
            case 4:
              auVar85 = minps(auVar85,_DAT_004f2180);
              uVar35 = -(uint)(auVar85._0_4_ < -88.37626);
              uVar59 = -(uint)(auVar85._4_4_ < -88.37626);
              uVar60 = -(uint)(auVar85._8_4_ < 0.0);
              uVar61 = -(uint)(auVar85._12_4_ < 0.0);
              auVar62._0_4_ = (uint)DAT_004f2180 & uVar35;
              auVar62._4_4_ = DAT_004f2180._4_4_ & uVar59;
              auVar62._8_4_ = DAT_004f2180._8_4_ & uVar60;
              auVar62._12_4_ = DAT_004f2180._12_4_ & uVar61;
              auVar72._0_4_ = ~uVar35 & (uint)-auVar85._0_4_;
              auVar72._4_4_ = ~uVar59 & (uint)-auVar85._4_4_;
              auVar72._8_4_ = ~uVar60 & (uint)-auVar85._8_4_;
              auVar72._12_4_ = ~uVar61 & (uint)-auVar85._12_4_;
              fVar105 = expf(SUB164(auVar72 | auVar62,0));
              fStack_164 = SUB164(auVar72 | auVar62,4);
              auVar63._0_4_ = expf(fStack_164);
              auVar63._4_12_ = extraout_var;
              auVar78._0_4_ = fVar105 + 1.0;
              auVar78._4_4_ = auVar63._0_4_ + 1.0;
              auVar78._8_4_ = extraout_XMM0_Db + 0.0;
              auVar78._12_4_ = extraout_var._0_4_ + 0.0;
              auVar85 = rcpps(auVar63,auVar78);
              fVar105 = auVar85._0_4_;
              fVar106 = auVar85._4_4_;
              uVar36 = CONCAT44((1.0 - auVar78._4_4_ * fVar106) * fVar106 + fVar106,
                                (1.0 - auVar78._0_4_ * fVar105) * fVar105 + fVar105);
              break;
            case 5:
              local_68 = auVar95;
              fVar107 = expf(fVar105);
              fVar107 = logf(fVar107 + 1.0);
              fVar107 = tanhf(fVar107);
              fVar108 = expf((float)local_68._0_4_);
              fVar108 = logf(fVar108 + 1.0);
              fVar108 = tanhf(fVar108);
              uVar36 = CONCAT44(fVar106 * fVar108,fVar105 * fVar107);
              break;
            case 6:
              fVar107 = *pfVar31;
              fVar108 = pfVar31[1];
              fVar96 = -fVar108 / fVar107;
              fVar87 = 0.0;
              if ((fVar96 <= fVar105) && (fVar87 = fVar105, fVar105 <= 1.0 / fVar107 + fVar96)) {
                fVar87 = (fVar107 * fVar105 + fVar108) * fVar105;
              }
              if (fVar96 <= fVar106) {
                auVar86._4_12_ = auVar85._4_12_;
                auVar86._0_4_ = fVar87;
                uVar36 = auVar86._0_8_;
                if (fVar106 <= fVar96 + 1.0 / fVar107) {
                  uVar36 = CONCAT44((fVar107 * fVar106 + fVar108) * fVar106,fVar87);
                }
              }
              else {
                uVar36 = (ulong)(uint)fVar87;
              }
            }
          }
          *puVar51 = (int)uVar36;
          *puVar43 = (int)(uVar36 >> 0x20);
          puVar51 = puVar51 + 1;
          puVar43 = puVar43 + 1;
          iVar37 = iVar37 + iVar44;
          lVar48 = lVar48 + lVar1;
          lVar40 = lVar40 + lVar1;
        }
      }
      lVar53 = lVar53 * lVar41;
      iVar44 = top_blob->w;
      sVar12 = top_blob->elemsize;
      pvVar11 = top_blob->data;
      uVar23 = 0;
      if (0 < (int)local_50) {
        uVar23 = local_50 & 0xffffffff;
      }
      for (uVar45 = (ulong)(iVar38 * 4 + (int)local_58 * 2); (long)uVar45 < (long)local_70;
          uVar45 = uVar45 + 1) {
        uVar35 = (int)uVar45 >> 0x1f;
        uVar30 = (ulong)uVar35 << 0x20 | uVar45 & 0xffffffff;
        sVar13 = (this->weight_data_tm).cstep;
        sVar15 = (this->weight_data_tm).elemsize;
        puVar51 = (undefined4 *)((long)iVar44 * sVar12 * uVar45 + (long)pvVar11);
        pvVar14 = (this->weight_data_tm).data;
        pfVar31 = *(float **)(&this->field_0xf8 + (long)p_Var9);
        lVar41 = 0;
        iVar38 = 0;
        lVar29 = lVar58 * 4;
        for (uVar26 = 0; uVar26 != uVar23; uVar26 = uVar26 + 1) {
          if (lVar10 == 0) {
            fVar105 = 0.0;
          }
          else {
            fVar105 = *(float *)(lVar10 + uVar45 * 4);
          }
          lVar40 = (long)local_b8.w *
                   CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
          lVar48 = (long)local_b8.data + lVar29;
          pfVar25 = (float *)((long)local_b8.data + lVar41);
          auVar85 = ZEXT816(0);
          uVar39 = 0;
          pfVar50 = (float *)((long)((int)((long)((ulong)uVar35 << 0x20 | uVar45 & 0xffffffff) % 2)
                                     + (int)((long)uVar30 / 4) +
                                    (int)(char)((char)((long)uVar30 % 4) / '\x02')) * sVar13 *
                              sVar15 + (long)pvVar14);
          while( true ) {
            local_180 = (int)lVar53;
            if (local_180 <= (int)((uint)uVar39 | 3)) break;
            lVar49 = (int)((long)((ulong)(uint)((int)(uint)uVar39 >> 0x1f) << 0x20 |
                                 uVar39 & 0xffffffff) / (long)iVar6) * lVar40;
            if (iVar6 == 4) {
              pfVar27 = (float *)((long)local_b8.data + lVar49 + (long)iVar38 * 4);
              uVar52 = uVar55;
              pfVar46 = pfVar50;
              while (iVar37 = (int)uVar52, uVar52 = (ulong)(iVar37 - 1), iVar37 != 0) {
                auVar73._0_4_ = auVar85._0_4_ + *pfVar46 * *pfVar27;
                auVar73._4_4_ = auVar85._4_4_ + pfVar46[1] * pfVar27[1];
                auVar73._8_4_ = auVar85._8_4_ + pfVar46[2] * pfVar27[2];
                auVar73._12_4_ = auVar85._12_4_ + pfVar46[3] * pfVar27[3];
                pfVar46 = pfVar46 + 4;
                pfVar27 = pfVar27 + iVar33;
                auVar85 = auVar73;
              }
              pfVar50 = pfVar50 + uVar55 * 4;
            }
            else {
              pfVar27 = (float *)((long)local_b8.data +
                                 lVar49 + (long)(iVar7 * iVar6 * (int)uVar26) * 4);
            }
            uVar52 = uVar55;
            pfVar46 = pfVar50;
            if (iVar6 == 1) {
              while ((int)uVar52 != 0) {
                auVar74._0_4_ = auVar85._0_4_ + *pfVar27 * *pfVar46;
                auVar74._4_4_ = auVar85._4_4_ + pfVar27[lVar58] * pfVar46[1];
                auVar74._8_4_ = auVar85._8_4_ + pfVar27[iVar20] * pfVar46[2];
                auVar74._12_4_ = auVar85._12_4_ + pfVar27[iVar28] * pfVar46[3];
                pfVar27 = pfVar27 + lVar56;
                uVar52 = (ulong)((int)uVar52 - 1);
                pfVar46 = pfVar46 + 4;
                auVar85 = auVar74;
              }
              pfVar50 = pfVar50 + uVar55 * 4;
            }
            uVar39 = uVar39 + 4;
            lVar48 = lVar48 + lVar40 * 4;
            pfVar25 = pfVar25 + lVar40;
          }
          auVar81._4_4_ = auVar85._12_4_ + auVar85._4_4_;
          auVar81._0_4_ = auVar81._4_4_;
          auVar81._8_4_ = auVar81._4_4_;
          auVar81._12_4_ = auVar81._4_4_;
          auVar82._4_12_ = auVar81._4_12_;
          auVar82._0_4_ = auVar81._4_4_ + fVar105 + auVar85._8_4_ + auVar85._0_4_;
          for (; (long)(uVar39 | 1) < lVar53; uVar39 = uVar39 + 2) {
            lVar49 = 0;
            for (lVar54 = 0; uVar18 != (uint)lVar54; lVar54 = lVar54 + 1) {
              auVar82._0_4_ =
                   auVar82._0_4_ +
                   *(float *)((long)pfVar25 + lVar49) * (float)*(undefined8 *)(pfVar50 + lVar54 * 2)
                   + *(float *)(lVar48 + lVar49) *
                     (float)((ulong)*(undefined8 *)(pfVar50 + lVar54 * 2) >> 0x20);
              lVar49 = lVar49 + lVar57;
            }
            pfVar50 = pfVar50 + uVar55 * 2;
            lVar48 = lVar48 + lVar40 * 2;
            pfVar25 = (float *)((long)pfVar25 + lVar40 * 2);
          }
          for (; fVar105 = auVar82._0_4_, (long)uVar39 < lVar53; uVar39 = uVar39 + 1) {
            pfVar27 = pfVar25;
            for (lVar48 = 0; uVar18 != (uint)lVar48; lVar48 = lVar48 + 1) {
              auVar82._0_4_ = auVar82._0_4_ + pfVar50[lVar48] * *pfVar27;
              pfVar27 = pfVar27 + lVar56;
            }
            pfVar50 = pfVar50 + uVar55;
            pfVar25 = (float *)((long)pfVar25 + lVar40);
          }
          auVar65 = auVar82;
          switch(iVar8) {
          case 1:
            if (fVar105 <= 0.0) {
              auVar19._12_4_ = 0;
              auVar19._0_12_ = auVar82._4_12_;
              auVar65 = auVar19 << 0x20;
            }
            break;
          case 2:
            auVar65 = ZEXT416((uint)((float)(~-(uint)(0.0 < fVar105) & (uint)*pfVar31 |
                                            -(uint)(0.0 < fVar105) & 0x3f800000) * fVar105));
            break;
          case 3:
            if (fVar105 <= *pfVar31) {
              auVar82._0_4_ = *pfVar31;
            }
            fVar105 = pfVar31[1];
            auVar65 = auVar82;
            if (fVar105 < auVar82._0_4_) {
LAB_00495505:
              auVar65 = ZEXT416((uint)fVar105);
            }
            break;
          case 4:
            if (88.37626 <= fVar105) {
              fVar105 = 88.37626;
            }
            fVar105 = expf((float)(-(uint)(fVar105 < -88.37626) & 0x42b0c0a5 |
                                  ~-(uint)(fVar105 < -88.37626) & (uint)-fVar105));
            auVar65 = ZEXT416((uint)(1.0 / (fVar105 + 1.0)));
            break;
          case 5:
            fVar106 = expf(fVar105);
            fVar106 = logf(fVar106 + 1.0);
            fVar106 = tanhf(fVar106);
            auVar65._0_4_ = fVar106 * fVar105;
            auVar65._4_12_ = extraout_var_00;
            break;
          case 6:
            fVar106 = *pfVar31;
            fVar107 = -pfVar31[1] / fVar106;
            auVar65 = ZEXT816(0);
            if ((fVar107 <= fVar105) && (auVar65 = auVar82, fVar105 <= fVar107 + 1.0 / fVar106)) {
              fVar105 = (fVar106 * fVar105 + pfVar31[1]) * fVar105;
              goto LAB_00495505;
            }
          }
          *puVar51 = auVar65._0_4_;
          puVar51 = puVar51 + 1;
          iVar38 = iVar38 + iVar7 * iVar6;
          lVar29 = lVar29 + lVar1;
          lVar41 = lVar41 + lVar1;
        }
      }
      iVar28 = 0;
    }
  }
  piVar21 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
  if (piVar21 != (int *)0x0) {
    LOCK();
    *piVar21 = *piVar21 + -1;
    UNLOCK();
    if (*piVar21 == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        free(local_b8.data);
      }
      else {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar28;
}

Assistant:

int Convolution1D_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    convolution1d_packed(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, kernel_w, dilation_w, stride_w, activation_type, activation_params, opt);

    return 0;
}